

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::SingleVertexArrayOutputTypeGroup::init
          (SingleVertexArrayOutputTypeGroup *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  OutputType outputType_;
  Storage storage_;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc;
  OutputType type_00;
  GLValue GVar2;
  GLValue GVar3;
  bool local_20c;
  bool local_20b;
  bool local_20a;
  bool local_209;
  undefined1 local_1f8 [8];
  Spec spec;
  undefined4 uStack_1bc;
  undefined1 local_1b0 [8];
  ArraySpec arraySpec;
  undefined1 local_168 [4];
  bool outputIsUnsignedInteger;
  bool outputIsSignedInteger;
  bool inputIsUnignedInteger;
  bool inputIsSignedInteger;
  string local_148;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string name;
  int local_50;
  int countNdx;
  int componentCount;
  int storageNdx;
  int outputTypeNdx;
  int counts [2];
  Storage storages [1];
  OutputType outputTypes [9];
  SingleVertexArrayOutputTypeGroup *this_local;
  
  memcpy(counts + 1,&DAT_02bafb30,0x24);
  memset(counts,0,4);
  _storageNdx = 0x10000000001;
  componentCount = 0;
  iVar1 = 1;
  while (componentCount < 9) {
    for (countNdx = 0; countNdx < 1; countNdx = countNdx + 1) {
      for (local_50 = 2; local_50 < 5; local_50 = local_50 + 1) {
        for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 2;
            name.field_2._12_4_ = name.field_2._12_4_ + 1) {
          typeToString<int>(&local_118,local_50);
          std::operator+(&local_f8,"components",&local_118);
          std::operator+(&local_d8,&local_f8,"_");
          deqp::gls::Array::outputTypeToString_abi_cxx11_
                    (&local_148,(Array *)(ulong)(uint)counts[(long)componentCount + 1],type_00);
          std::operator+(&local_b8,&local_d8,&local_148);
          std::operator+(&local_98,&local_b8,"_quads");
          typeToString<int>((string *)local_168,(&storageNdx)[(int)name.field_2._12_4_]);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78,&local_98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168);
          std::__cxx11::string::~string((string *)local_168);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_118);
          local_209 = true;
          if ((this->m_type != INPUTTYPE_INT) && (local_209 = true, this->m_type != INPUTTYPE_SHORT)
             ) {
            local_209 = this->m_type == INPUTTYPE_BYTE;
          }
          arraySpec.max.field_1._7_1_ = local_209;
          local_20a = true;
          if ((this->m_type != INPUTTYPE_UNSIGNED_INT) &&
             (local_20a = true, this->m_type != INPUTTYPE_UNSIGNED_SHORT)) {
            local_20a = this->m_type == INPUTTYPE_UNSIGNED_BYTE;
          }
          arraySpec.max.field_1._6_1_ = local_20a;
          local_20b = true;
          if ((counts[(long)componentCount + 1] != 6) &&
             (local_20b = true, counts[(long)componentCount + 1] != 7)) {
            local_20b = counts[(long)componentCount + 1] == 8;
          }
          arraySpec.max.field_1._5_1_ = local_20b;
          local_20c = true;
          if ((counts[(long)componentCount + 1] != 9) &&
             (local_20c = true, counts[(long)componentCount + 1] != 10)) {
            local_20c = counts[(long)componentCount + 1] == 0xb;
          }
          arraySpec.max.field_1._4_1_ = local_20c;
          if ((((this->m_type == INPUTTYPE_FLOAT) || (this->m_type == INPUTTYPE_HALF)) ||
              (this->m_type == INPUTTYPE_FIXED)) && (3 < counts[(long)componentCount + 1])) {
            arraySpec.max.field_1.fl.m_value = (Float)1.82169e-44;
          }
          else if (((this->m_type == INPUTTYPE_UNSIGNED_INT_2_10_10_10) ||
                   (this->m_type == INPUTTYPE_INT_2_10_10_10)) &&
                  (3 < counts[(long)componentCount + 1])) {
            arraySpec.max.field_1.fl.m_value = (Float)1.82169e-44;
          }
          else if (((this->m_type == INPUTTYPE_UNSIGNED_INT_2_10_10_10) ||
                   (this->m_type == INPUTTYPE_INT_2_10_10_10)) && (local_50 != 4)) {
            arraySpec.max.field_1.fl.m_value = (Float)1.82169e-44;
          }
          else if ((local_209 == false) || (local_20c == false)) {
            if ((local_20a == false) || (local_20b == false)) {
              type = this->m_type;
              outputType_ = counts[(long)componentCount + 1];
              storage_ = counts[countNdx];
              GVar2 = deqp::gls::GLValue::getMinValue(type);
              GVar3 = deqp::gls::GLValue::getMaxValue(this->m_type);
              spec.arrays.
              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar3.type;
              max_._4_4_ = spec.arrays.
                           super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              max_.type = (InputType)
                          spec.arrays.
                          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              min_._4_4_ = uStack_1bc;
              min_.type = GVar2.type;
              min_.field_1 = GVar2.field_1;
              max_.field_1 = GVar3.field_1;
              deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                        ((ArraySpec *)local_1b0,type,outputType_,storage_,USAGE_DYNAMIC_DRAW,
                         local_50,0,0,false,min_,max_);
              deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_1f8);
              local_1f8._0_4_ = PRIMITIVE_TRIANGLES;
              local_1f8._4_4_ = (&storageNdx)[(int)name.field_2._12_4_];
              spec.primitive = PRIMITIVE_POINTS;
              std::
              vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
              ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                           *)&spec.first,(value_type *)local_1b0);
              this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
              testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
              renderCtx = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
              name_00 = (char *)std::__cxx11::string::c_str();
              desc = (char *)std::__cxx11::string::c_str();
              deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                        (this_00,testCtx,renderCtx,(Spec *)local_1f8,name_00,desc);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
              deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_1f8);
              arraySpec.max.field_1.fl.m_value = (Float)0.0;
            }
            else {
              arraySpec.max.field_1.fl.m_value = (Float)1.82169e-44;
            }
          }
          else {
            arraySpec.max.field_1.fl.m_value = (Float)1.82169e-44;
          }
          std::__cxx11::string::~string((string *)local_78);
        }
      }
    }
    componentCount = componentCount + 1;
    iVar1 = componentCount;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayOutputTypeGroup::init (void)
{
	Array::OutputType	outputTypes[]	= {Array::OUTPUTTYPE_VEC2, Array::OUTPUTTYPE_VEC3, Array::OUTPUTTYPE_VEC4, Array::OUTPUTTYPE_IVEC2, Array::OUTPUTTYPE_IVEC3, Array::OUTPUTTYPE_IVEC4, Array::OUTPUTTYPE_UVEC2, Array::OUTPUTTYPE_UVEC3, Array::OUTPUTTYPE_UVEC4 };
	Array::Storage		storages[]		= {Array::STORAGE_USER};
	int					counts[]		= {1, 256};

	for (int outputTypeNdx = 0; outputTypeNdx < DE_LENGTH_OF_ARRAY(outputTypes); outputTypeNdx++)
	{
		for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
		{
			for (int componentCount = 2; componentCount < 5; componentCount++)
			{
				for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
				{
					std::string name = "components" + typeToString(componentCount) + "_" + Array::outputTypeToString(outputTypes[outputTypeNdx]) + "_quads" + typeToString(counts[countNdx]);

					const bool inputIsSignedInteger		= m_type == Array::INPUTTYPE_INT || m_type == Array::INPUTTYPE_SHORT || m_type == Array::INPUTTYPE_BYTE;
					const bool inputIsUnignedInteger	= m_type == Array::INPUTTYPE_UNSIGNED_INT || m_type == Array::INPUTTYPE_UNSIGNED_SHORT || m_type == Array::INPUTTYPE_UNSIGNED_BYTE;
					const bool outputIsSignedInteger	= outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_IVEC2 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_IVEC3 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_IVEC4;
					const bool outputIsUnsignedInteger	= outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_UVEC2 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_UVEC3 || outputTypes[outputTypeNdx] == Array::OUTPUTTYPE_UVEC4;

					// If input type is float type and output type is int type skip
					if ((m_type == Array::INPUTTYPE_FLOAT ||  m_type == Array::INPUTTYPE_HALF || m_type == Array::INPUTTYPE_FIXED) && (outputTypes[outputTypeNdx] >= Array::OUTPUTTYPE_INT))
						continue;

					if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && (outputTypes[outputTypeNdx] >= Array::OUTPUTTYPE_INT))
						continue;

					if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && componentCount != 4)
						continue;

					// Loading signed data as unsigned causes undefined values and vice versa
					if (inputIsSignedInteger && outputIsUnsignedInteger)
						continue;
					if (inputIsUnignedInteger && outputIsSignedInteger)
						continue;

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																	outputTypes[outputTypeNdx],
																	storages[storageNdx],
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	0,
																	0,
																	false,
																	GLValue::getMinValue(m_type),
																	GLValue::getMaxValue(m_type));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}